

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<double> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontSym<double>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_02542b88;
  TPZStackEqnStorage<double>::TPZStackEqnStorage((TPZStackEqnStorage<double> *)(in_RDI + 0x20));
  this_00 = in_RDI + 0x1f9e8;
  TPZFrontSym<double>::TPZFrontSym((TPZFrontSym<double> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x1fb20);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x1fb40));
  TPZFrontSym<double>::Reset((TPZFrontSym<double> *)this_00,(int64_t)this_01);
  TPZStackEqnStorage<double>::Reset((TPZStackEqnStorage<double> *)0x1cda999);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x1fb18) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x1fb10) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}